

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

void __thiscall SQLite::Statement::reset(Statement *this)

{
  int aRet;
  int ret;
  Statement *this_local;
  
  aRet = tryReset(this);
  check(this,aRet);
  return;
}

Assistant:

void Statement::reset()
{
    const int ret = tryReset();
    check(ret);
}